

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O3

_Bool place_new_monster_one
                (chunk *c,loc grid,monster_race *race,_Bool sleep,monster_group_info group_info,
                uint8_t origin)

{
  bitflag *pbVar1;
  uint32_t *puVar2;
  uint8_t uVar3;
  _Bool _Var4;
  int16_t iVar5;
  wchar_t wVar6;
  uint uVar7;
  uint32_t uVar8;
  wchar_t wVar9;
  monster *pmVar10;
  monster_conflict *pmVar11;
  char *fmt;
  wchar_t val;
  monster_conflict monster_body;
  monster_group_info local_230;
  monster_conflict local_220;
  
  local_230.player_race = group_info.player_race;
  local_230._0_8_ = group_info._0_8_;
  _Var4 = square_in_bounds((chunk_conflict *)c,grid);
  if (!_Var4) {
    __assert_fail("square_in_bounds(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x70e,
                  "_Bool place_new_monster_one(struct chunk *, struct loc, struct monster_race *, _Bool, struct monster_group_info, uint8_t)"
                 );
  }
  if ((race == (monster_race *)0x0) || (race->name == (char *)0x0)) {
    __assert_fail("race && race->name",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x70f,
                  "_Bool place_new_monster_one(struct chunk *, struct loc, struct monster_race *, _Bool, struct monster_group_info, uint8_t)"
                 );
  }
  pmVar10 = square_monster((chunk_conflict *)c,grid);
  if ((pmVar10 != (monster *)0x0) || (_Var4 = loc_eq(player->grid,(loc_conflict)grid), _Var4)) {
    return false;
  }
  pbVar1 = race->flags;
  _Var4 = flag_has_dbg(pbVar1,0xc,0x4c,"race->flags","RF_HURT_LIGHT");
  if ((_Var4) && (_Var4 = is_daylight(), _Var4)) {
    return false;
  }
  _Var4 = square_is_monster_walkable((chunk_conflict *)c,grid);
  if (!_Var4) {
    return false;
  }
  _Var4 = square_ispassable((chunk_conflict *)c,grid);
  if (!_Var4) {
    __assert_fail("square_ispassable(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x71d,
                  "_Bool place_new_monster_one(struct chunk *, struct loc, struct monster_race *, _Bool, struct monster_group_info, uint8_t)"
                 );
  }
  _Var4 = square_iswarded((chunk_conflict *)c,grid);
  if (_Var4) {
    return false;
  }
  _Var4 = square_isdecoyed((chunk_conflict *)c,grid);
  if (_Var4) {
    return false;
  }
  _Var4 = flag_has_dbg(pbVar1,0xc,1,"race->flags","RF_UNIQUE");
  if ((_Var4) && ((int)(uint)race->max_num <= race->cur_num)) {
    return false;
  }
  _Var4 = flag_has_dbg(pbVar1,0xc,2,"race->flags","RF_PLAYER_GHOST");
  if ((_Var4) && (c->ghost->bones_selector != L'\0')) {
    return false;
  }
  _Var4 = flag_has_dbg(pbVar1,0xc,0xc,"race->flags","RF_FORCE_DEPTH");
  if (_Var4) {
    wVar6 = c->depth;
    wVar9 = race->level;
    if (wVar6 < wVar9) {
      return false;
    }
  }
  else {
    wVar9 = race->level;
    wVar6 = c->depth;
  }
  uVar8 = 0xffffffff;
  if (!CARRY4(wVar9 * wVar9,c->mon_rating)) {
    uVar8 = wVar9 * wVar9 + c->mon_rating;
  }
  c->mon_rating = uVar8;
  _Var4 = flag_has_dbg(pbVar1,0xc,1,"race->flags","RF_UNIQUE");
  if (wVar6 < wVar9) {
    if ((player->opts).opt[0x16] == true) {
      fmt = "Deep monster (%s).";
      if (_Var4) {
        fmt = "Deep unique (%s).";
      }
      msg(fmt);
    }
    wVar9 = race->level;
    uVar7 = wVar9 * wVar9 * (wVar9 - c->depth);
    uVar8 = 0xffffffff;
    if (!CARRY4(uVar7,c->mon_rating)) {
      uVar8 = uVar7 + c->mon_rating;
    }
    c->mon_rating = uVar8;
  }
  else if ((_Var4) && ((player->opts).opt[0x16] == true)) {
    msg("Unique (%s).");
  }
  memset(&local_220.original_race,0,0x1e8);
  _Var4 = flag_has_dbg(pbVar1,0xc,2,"race->flags","RF_PLAYER_GHOST");
  if (_Var4) {
    _Var4 = prepare_ghost(c,race->ridx,&local_220,false);
    if (!_Var4) {
      return false;
    }
    race = r_info + ((ulong)z_info->r_max - 1);
  }
  local_220.race = race;
  if (sleep) {
    wVar9 = race->sleep;
    if (wVar9 == L'\0') {
      _Var4 = is_night();
      if ((_Var4) && (wVar9 = level_topography((int)player->place), wVar9 != L'\0')) {
        local_220.m_timed[0] = local_220.m_timed[0] + 0x14;
      }
    }
    else {
      uVar8 = Rand_div(wVar9 * 10);
      local_220.m_timed[0] = (short)uVar8 + (short)wVar9 * 2 + 1;
    }
  }
  pbVar1 = race->flags;
  _Var4 = flag_has_dbg(pbVar1,0xc,1,"race->flags","RF_UNIQUE");
  if (_Var4) {
    local_220.hp = (short)race->avg_hp;
  }
  else {
    wVar9 = mon_hp(race,RANDOMISE);
    local_220.hp = 1;
    if (1 < (short)wVar9) {
      local_220.hp = (short)wVar9;
    }
  }
  uVar3 = (uint8_t)race->speed;
  local_220.maxhp = local_220.hp;
  local_220.mspeed = uVar3;
  _Var4 = flag_has_dbg(pbVar1,0xc,1,"race->flags","RF_UNIQUE");
  if ((!_Var4) && (wVar9 = turn_energy(race->speed), 0x12 < (uint)(wVar9 + L'\t'))) {
    uVar8 = Rand_div((wVar9 / 10) * 2 + 1);
    local_220.mspeed = uVar3 + ((char)uVar8 - (char)(wVar9 / 10));
  }
  uVar8 = Rand_div(0x32);
  local_220.energy = (uint8_t)uVar8;
  _Var4 = flag_has_dbg(pbVar1,0xc,0xd,"race->flags","RF_FORCE_SLEEP");
  if (_Var4) {
    flag_on_dbg(local_220.mflag,2,3,"mon->mflag","MFLAG_NICE");
    race = local_220.race;
  }
  if (race->light != L'\0') {
    puVar2 = &player->upkeep->update;
    *puVar2 = *puVar2 | 0xc0;
  }
  _Var4 = flag_has_dbg(pbVar1,0xc,0x16,"race->flags","RF_UNAWARE");
  if (_Var4) {
    flag_on_dbg(local_220.mflag,2,7,"mon->mflag","MFLAG_CAMOUFLAGE");
  }
  else {
    flag_off(local_220.mflag,2,7);
  }
  _Var4 = flag_has_dbg(pbVar1,0xc,8,"race->flags","RF_ATTR_RAND");
  if (_Var4) {
    uVar8 = Rand_div(0x1d);
    local_220.attr = (char)uVar8 + '\x01';
  }
  local_220.group_info[0].index = local_230.index;
  local_220.group_info[0].role = local_230.role;
  local_220.group_info[0].player_race = local_230.player_race;
  _Var4 = flag_has_dbg((local_220.race)->flags,0xc,0x24,"mon->race->flags","RF_PLAYER");
  if (_Var4) {
    pmVar11 = (monster_conflict *)
              monster_group_player_race((chunk_conflict *)c,(monster *)&local_220);
    local_220.midx = L'\xfffffffe';
    monster_group_assign((chunk_conflict *)c,(monster *)&local_220,&local_230,false);
    local_220.player_race = (player_race *)pmVar11;
    if (pmVar11 == (monster_conflict *)0x0) {
      local_220.player_race = get_player_race();
      set_monster_group_player_race((chunk_conflict *)c,(monster *)&local_220,local_220.player_race)
      ;
    }
    _Var4 = mon_is_neutral(c,(monster_conflict *)local_220.player_race,grid);
    if (_Var4) {
      local_220.target.midx = L'\0';
      goto LAB_0017e294;
    }
  }
  local_220.target.midx = L'\xffffffff';
LAB_0017e294:
  _Var4 = flag_has_dbg(pbVar1,0xc,0x25,"race->flags","RF_TERRITORIAL");
  if (_Var4) {
    local_220.home = grid;
  }
  iVar5 = place_monster(c,grid,&local_220,origin);
  return iVar5 != 0;
}

Assistant:

static bool place_new_monster_one(struct chunk *c, struct loc grid,
		struct monster_race *race, bool sleep,
		struct monster_group_info group_info,
		uint8_t origin)
{
	int i;
	struct monster *mon;
	struct monster monster_body;

	assert(square_in_bounds(c, grid));
	assert(race && race->name);

	/* Not where monsters already are */
	if (square_monster(c, grid)) return false;

	/* Not where the player already is */
	if (loc_eq(player->grid, grid)) return false;

	/* No light hating monsters in daytime */
	if (rf_has(race->flags, RF_HURT_LIGHT) && is_daylight()) return false;

	/* Prevent monsters from being placed where they cannot walk, but allow
	 * other feature types */
	if (!square_is_monster_walkable(c, grid)) return false;
	assert(square_ispassable(c, grid));

	/* No creation on glyphs */
	if (square_iswarded(c, grid) || square_isdecoyed(c, grid)) return false;

	/* "unique" monsters must be "unique" */
	if (rf_has(race->flags, RF_UNIQUE) && (race->cur_num >= race->max_num))
		return false;

	/* Only 1 player ghost at a time */
	if (rf_has(race->flags, RF_PLAYER_GHOST) && c->ghost->bones_selector)
		return false;

	/* Depth monsters may NOT be created out of depth */
	if (rf_has(race->flags, RF_FORCE_DEPTH) && c->depth < race->level)
		return false;

	/* Add to level feeling, note uniques for cheaters */
	add_to_monster_rating(c, race->level * race->level);

	/* Check out-of-depth-ness */
	if (race->level > c->depth) {
		if (rf_has(race->flags, RF_UNIQUE)) { /* OOD unique */
			if (OPT(player, cheat_hear))
				msg("Deep unique (%s).", race->name);
		} else { /* Normal monsters but OOD */
			if (OPT(player, cheat_hear))
				msg("Deep monster (%s).", race->name);
		}
		/* Boost rating by power per 10 levels OOD */
		add_to_monster_rating(c, (race->level - c->depth) * race->level
			* race->level);
	} else if (rf_has(race->flags, RF_UNIQUE) && OPT(player, cheat_hear)) {
		msg("Unique (%s).", race->name);
	}

	/* Get local monster */
	mon = &monster_body;

	/* Clean out the monster */
	memset(mon, 0, sizeof(struct monster));

	/* If the monster is a player ghost, perform various manipulations 
	 * on it, and forbid ghost creation if something goes wrong. */
	if (rf_has(race->flags, RF_PLAYER_GHOST)) {
		if (!prepare_ghost(c, race->ridx, mon, false)) return false;

		/* Point to the special "ghost slot" */
		race = &r_info[PLAYER_GHOST_RACE];
	}

	/* Save the race */
	mon->race = race;

	/* Enforce sleeping if needed */
	if (sleep) {
		if (race->sleep) {
			int val = race->sleep;
			mon->m_timed[MON_TMD_SLEEP] = ((val * 2) + randint1(val * 10));
		} else if (is_night() &&
				   (level_topography(player->place) != TOP_TOWN)) {
			mon->m_timed[MON_TMD_SLEEP] += 20;
		}
	}

	/* Uniques get a fixed amount of HP */
	if (rf_has(race->flags, RF_UNIQUE))
		mon->maxhp = race->avg_hp;
	else {
		mon->maxhp = mon_hp(race, RANDOMISE);
		mon->maxhp = MAX(mon->maxhp, 1);
	}

	/* And start out fully healthy */
	mon->hp = mon->maxhp;

	/* Extract the monster base speed */
	mon->mspeed = race->speed;

	/* Hack -- small racial variety */
	if (!rf_has(race->flags, RF_UNIQUE)) {
		/* Allow some small variation per monster */
		i = turn_energy(race->speed) / 10;
		if (i) mon->mspeed += rand_spread(0, i);
	}

	/* Give a random starting energy */
	mon->energy = (uint8_t)randint0(50);

	/* Force monster to wait for player */
	if (rf_has(race->flags, RF_FORCE_SLEEP))
		mflag_on(mon->mflag, MFLAG_NICE);

	/* Affect light? */
	if (mon->race->light != 0)
		player->upkeep->update |= PU_UPDATE_VIEW | PU_MONSTERS;

	/* Is this obviously a monster? (Mimics etc. aren't) */
	if (rf_has(race->flags, RF_UNAWARE))
		mflag_on(mon->mflag, MFLAG_CAMOUFLAGE);
	else
		mflag_off(mon->mflag, MFLAG_CAMOUFLAGE);

	/* Set the color if necessary */
	if (rf_has(race->flags, RF_ATTR_RAND))
		mon->attr = randint1(BASIC_COLORS - 1);

	/* Set the group info */
	mon->group_info[PRIMARY_GROUP].index = group_info.index;
	mon->group_info[PRIMARY_GROUP].role = group_info.role;
	mon->group_info[PRIMARY_GROUP].player_race = group_info.player_race;

	/* Set hostility, or possible neutrality for player race monsters */
	if (rf_has(mon->race->flags, RF_PLAYER)) {
		struct player_race *p_race = monster_group_player_race(c, mon);

		/* Give the monster the special index to indicate it needs updating */
		mon->midx = MIDX_FAKE;

		/* Assign the monster to its group */
		monster_group_assign(c, mon, &group_info, false);

		/* Set player race if needed */
		if (p_race) {
			/* Use the existing race */
			mon->player_race = p_race;
		} else {
			/* Pick a race and set the monster and group races to it */
			p_race = get_player_race();
			mon->player_race = p_race;
			set_monster_group_player_race(c, mon, p_race);
		}

		/* Set hostility */
		if (mon_is_neutral(c, mon, grid)) {
			mon->target.midx = 0;
		} else {
			mon->target.midx = -1;
		}
	} else {
		/* Set to target the player */
		mon->target.midx = -1;
	}

	/* Mark territorial monster's home */
	if (rf_has(race->flags, RF_TERRITORIAL)) {
		mon->home = grid;
	}

	/* Place the monster in the dungeon */
	if (!place_monster(c, grid, mon, origin))
		return (false);

	/* Success */
	return (true);
}